

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O2

PipelineResourceSignatureDescWrapper * __thiscall
Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc
          (PipelineResourceSignatureDescWrapper *__return_storage_ptr__,PipelineStateGLImpl *this,
          TShaderStages *ShaderStages,SHADER_TYPE ActiveStages)

{
  PipelineResourceLayoutDesc *ResourceLayout;
  uint SRBAllocationGranularity;
  pointer ppSVar1;
  GLProgram *this_00;
  pointer pIVar2;
  anon_class_32_4_bf853c0f HandleUB;
  anon_class_32_4_bf853c0f HandleUB_00;
  anon_class_32_4_bf853c0f HandleTexture;
  anon_class_32_4_bf853c0f HandleTexture_00;
  anon_class_32_4_bf853c0f HandleImg;
  anon_class_32_4_bf853c0f HandleImg_00;
  anon_class_32_4_bf853c0f HandleSB;
  anon_class_32_4_bf853c0f HandleSB_00;
  PIPELINE_RESOURCE_FLAGS SamplerResourceFlag;
  LinkStatus LVar3;
  ImmutableSamplerDesc *ImtblSam;
  pointer pIVar4;
  Uint32 NumAllowedTypes;
  ulong uVar5;
  char (*Args_1) [99];
  GLContextState *State;
  SHADER_RESOURCE_VARIABLE_TYPE *extraout_RDX;
  SHADER_RESOURCE_VARIABLE_TYPE *extraout_RDX_00;
  SHADER_RESOURCE_VARIABLE_TYPE *extraout_RDX_01;
  SHADER_RESOURCE_VARIABLE_TYPE *extraout_RDX_02;
  SHADER_RESOURCE_VARIABLE_TYPE *extraout_RDX_03;
  SHADER_RESOURCE_VARIABLE_TYPE *pSVar6;
  PipelineResourceLayoutDesc *pResourceLayout;
  char *pResourceLayout_00;
  element_type *this_01;
  size_t i;
  ulong uVar7;
  RefCntAutoPtr<Diligent::DeviceContextGLImpl> pImmediateCtx;
  string msg;
  unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
  UniqueResources;
  
  ResourceLayout =
       &(this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
        super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
        .m_Desc.ResourceLayout;
  SRBAllocationGranularity =
       (this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
       super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
       .m_Desc.SRBAllocationGranularity;
  Args_1 = (char (*) [99])(ulong)SRBAllocationGranularity;
  PipelineResourceSignatureDescWrapper::PipelineResourceSignatureDescWrapper
            (__return_storage_ptr__,
             (this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
             super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
             .m_Desc.super_DeviceObjectAttribs.Name,ResourceLayout,SRBAllocationGranularity);
  pResourceLayout = (PipelineResourceLayoutDesc *)0x770729;
  PipelineResourceSignatureDescWrapper::SetCombinedSamplerSuffix(__return_storage_ptr__,"_sampler");
  UniqueResources._M_h._M_buckets = &UniqueResources._M_h._M_single_bucket;
  UniqueResources._M_h._M_bucket_count = 1;
  UniqueResources._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  UniqueResources._M_h._M_element_count = 0;
  UniqueResources._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  UniqueResources._M_h._M_rehash_policy._M_next_resize = 0;
  UniqueResources._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (this->m_IsProgramPipelineSupported == true) {
    uVar7 = 0;
    pSVar6 = extraout_RDX;
    while( true ) {
      ppSVar1 = (ShaderStages->
                super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar5 = (long)(ShaderStages->
                    super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3;
      if (uVar5 <= uVar7) break;
      HandleUB.UniqueResources = &UniqueResources;
      HandleUB.ResourceLayout = ResourceLayout;
      HandleUB.SignDesc = __return_storage_ptr__;
      HandleUB.this = this;
      HandleTexture.UniqueResources = &UniqueResources;
      HandleTexture.ResourceLayout = ResourceLayout;
      HandleTexture.SignDesc = __return_storage_ptr__;
      HandleTexture.this = this;
      HandleImg.UniqueResources = &UniqueResources;
      HandleImg.ResourceLayout = ResourceLayout;
      HandleImg.SignDesc = __return_storage_ptr__;
      HandleImg.this = this;
      HandleSB.UniqueResources = &UniqueResources;
      HandleSB.ResourceLayout = ResourceLayout;
      HandleSB.SignDesc = __return_storage_ptr__;
      HandleSB.this = this;
      ShaderResourcesGL::
      ProcessConstResources<Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc(std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>const&,Diligent::SHADER_TYPE)::__0,Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc(std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>const&,Diligent::SHADER_TYPE)::__0,Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc(std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>const&,Diligent::SHADER_TYPE)::__0,Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc(std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>const&,Diligent::SHADER_TYPE)::__0>
                ((ppSVar1[uVar7]->m_pShaderResources).
                 super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,HandleUB,HandleTexture,HandleImg,HandleSB,pResourceLayout,pSVar6,
                 (Uint32)uVar5);
      uVar7 = uVar7 + 1;
      pSVar6 = extraout_RDX_00;
    }
    goto LAB_002b667a;
  }
  RenderDeviceBase<Diligent::EngineGLImplTraits>::GetImmediateContext
            ((RenderDeviceBase<Diligent::EngineGLImplTraits> *)&pImmediateCtx,
             (size_t)(this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
                     super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                     .m_pDevice);
  if (pImmediateCtx.m_pObject == (DeviceContextGLImpl *)0x0) {
    FormatString<char[26],char[14]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"pImmediateCtx",
               (char (*) [14])Args_1);
    Args_1 = (char (*) [99])0x90;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetDefaultSignatureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x90);
    std::__cxx11::string::~string((string *)&msg);
  }
  this_00 = (this->m_GLPrograms->super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  if (this_00 == (GLProgram *)0x0) {
LAB_002b64bf:
    FormatString<char[26],char[99]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_GLPrograms[0] != nullptr && m_GLPrograms[0]->GetLinkStatus() == GLProgram::LinkStatus::Succeeded"
               ,Args_1);
    pResourceLayout_00 = "GetDefaultSignatureDesc";
    Args_1 = (char (*) [99])0x91;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetDefaultSignatureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x91);
    std::__cxx11::string::~string((string *)&msg);
    pSVar6 = extraout_RDX_02;
  }
  else {
    pResourceLayout_00 = (char *)0x0;
    LVar3 = GLProgram::GetLinkStatus(this_00,false);
    pSVar6 = extraout_RDX_01;
    if (LVar3 != Succeeded) goto LAB_002b64bf;
  }
  NumAllowedTypes = (Uint32)Args_1;
  this_01 = (((this->m_GLPrograms->
              super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            m_pResources).
            super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (this_01 == (element_type *)0x0) {
    SamplerResourceFlag = GetSamplerResourceFlag(this,ShaderStages,true);
    State = &(pImmediateCtx.m_pObject)->m_ContextState;
    pResourceLayout_00 = (char *)(ulong)ActiveStages;
    GLProgram::LoadResources
              ((this->m_GLPrograms->
               super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               ActiveStages,SamplerResourceFlag,State,false,SHADER_SOURCE_LANGUAGE_DEFAULT);
    NumAllowedTypes = (Uint32)State;
    this_01 = (((this->m_GLPrograms->
                super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              m_pResources).
              super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    pSVar6 = extraout_RDX_03;
  }
  HandleUB_00.UniqueResources = &UniqueResources;
  HandleUB_00.ResourceLayout = ResourceLayout;
  HandleUB_00.SignDesc = __return_storage_ptr__;
  HandleUB_00.this = this;
  HandleTexture_00.UniqueResources = &UniqueResources;
  HandleTexture_00.ResourceLayout = ResourceLayout;
  HandleTexture_00.SignDesc = __return_storage_ptr__;
  HandleTexture_00.this = this;
  HandleImg_00.UniqueResources = &UniqueResources;
  HandleImg_00.ResourceLayout = ResourceLayout;
  HandleImg_00.SignDesc = __return_storage_ptr__;
  HandleImg_00.this = this;
  HandleSB_00.UniqueResources = &UniqueResources;
  HandleSB_00.ResourceLayout = ResourceLayout;
  HandleSB_00.SignDesc = __return_storage_ptr__;
  HandleSB_00.this = this;
  ShaderResourcesGL::
  ProcessConstResources<Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc(std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>const&,Diligent::SHADER_TYPE)::__0,Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc(std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>const&,Diligent::SHADER_TYPE)::__0,Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc(std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>const&,Diligent::SHADER_TYPE)::__0,Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc(std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>const&,Diligent::SHADER_TYPE)::__0>
            (this_01,HandleUB_00,HandleTexture_00,HandleImg_00,HandleSB_00,
             (PipelineResourceLayoutDesc *)pResourceLayout_00,pSVar6,NumAllowedTypes);
  if ((this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
      super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
      .m_Desc.ResourceLayout.NumImmutableSamplers != 0) {
    pIVar2 = (__return_storage_ptr__->m_ImmutableSamplers).
             super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pIVar4 = (__return_storage_ptr__->m_ImmutableSamplers).
                  super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                  ._M_impl.super__Vector_impl_data._M_start; pIVar4 != pIVar2; pIVar4 = pIVar4 + 1)
    {
      pIVar4->ShaderStages = ActiveStages;
    }
  }
  RefCntAutoPtr<Diligent::DeviceContextGLImpl>::Release(&pImmediateCtx);
LAB_002b667a:
  std::
  _Hashtable<Diligent::ShaderResourceHashKey,_std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::ShaderResourceHashKey>,_Diligent::ShaderResourceHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&UniqueResources._M_h);
  return __return_storage_ptr__;
}

Assistant:

PipelineResourceSignatureDescWrapper PipelineStateGLImpl::GetDefaultSignatureDesc(
    const TShaderStages& ShaderStages,
    SHADER_TYPE          ActiveStages)
{
    const auto& ResourceLayout = m_Desc.ResourceLayout;

    PipelineResourceSignatureDescWrapper SignDesc{m_Desc.Name, ResourceLayout, m_Desc.SRBAllocationGranularity};
    SignDesc.SetCombinedSamplerSuffix(PipelineResourceSignatureDesc{}.CombinedSamplerSuffix);

    std::unordered_map<ShaderResourceHashKey, const ShaderResourcesGL::GLResourceAttribs&, ShaderResourceHashKey::Hasher> UniqueResources;

    const auto HandleResource = [&](const ShaderResourcesGL::GLResourceAttribs& Attribs) //
    {
        const auto VarDesc     = FindPipelineResourceLayoutVariable(ResourceLayout, Attribs.Name, Attribs.ShaderStages, nullptr);
        const auto it_assigned = UniqueResources.emplace(ShaderResourceHashKey{VarDesc.ShaderStages, Attribs.Name}, Attribs);
        if (it_assigned.second)
        {
            const auto Flags = Attribs.ResourceFlags | ShaderVariableFlagsToPipelineResourceFlags(VarDesc.Flags);
            SignDesc.AddResource(VarDesc.ShaderStages, Attribs.Name, Attribs.ArraySize, Attribs.ResourceType, VarDesc.Type, Flags);
        }
        else
        {
            VerifyResourceMerge(m_Desc, it_assigned.first->second, Attribs);
        }
    };

    if (m_IsProgramPipelineSupported)
    {
        for (size_t i = 0; i < ShaderStages.size(); ++i)
        {
            ShaderGLImpl* pShaderGL = ShaderStages[i];
            pShaderGL->GetShaderResources()->ProcessConstResources(HandleResource, HandleResource, HandleResource, HandleResource);
        }
    }
    else
    {
        auto pImmediateCtx = m_pDevice->GetImmediateContext(0);
        VERIFY_EXPR(pImmediateCtx);
        VERIFY_EXPR(m_GLPrograms[0] != nullptr && m_GLPrograms[0]->GetLinkStatus() == GLProgram::LinkStatus::Succeeded);

        if (!m_GLPrograms[0]->GetResources())
        {
            // Load resources first time this program is used
            const auto SamplerResFlag = GetSamplerResourceFlag(ShaderStages, true /*SilenceWarning*/);
            m_GLPrograms[0]->LoadResources(
                ActiveStages,
                SamplerResFlag,
                pImmediateCtx->GetContextState());
        }
        m_GLPrograms[0]->GetResources()->ProcessConstResources(HandleResource, HandleResource, HandleResource, HandleResource);

        if (ResourceLayout.NumImmutableSamplers > 0)
        {
            // Apply each immutable sampler to all shader stages
            SignDesc.ProcessImmutableSamplers(
                [ActiveStages](ImmutableSamplerDesc& SamDesc) //
                {
                    SamDesc.ShaderStages = ActiveStages;
                });
        }
    }

    return SignDesc;
}